

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MT19937.h
# Opt level: O2

void __thiscall Nova::MT19937<float>::MT19937(MT19937<float> *this)

{
  this->_vptr_MT19937 = (_func_int **)&PTR__MT19937_00148768;
  Set_Seed(this,0x1571);
  return;
}

Assistant:

MT19937()
    {Set_Seed();}